

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

bool QPDF::validatePDFVersion(char **p,string *version)

{
  bool bVar1;
  bool local_19;
  bool valid;
  string *version_local;
  char **p_local;
  
  local_19 = ::qpdf::util::is_digit(**p);
  if (local_19) {
    while (bVar1 = ::qpdf::util::is_digit(**p), bVar1) {
      *p = *p + 1;
      std::__cxx11::string::append((ulong)version,'\x01');
    }
    if ((**p == '.') && (bVar1 = ::qpdf::util::is_digit((*p)[1]), bVar1)) {
      *p = *p + 1;
      std::__cxx11::string::append((ulong)version,'\x01');
      while (bVar1 = ::qpdf::util::is_digit(**p), bVar1) {
        *p = *p + 1;
        std::__cxx11::string::append((ulong)version,'\x01');
      }
    }
    else {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool
QPDF::validatePDFVersion(char const*& p, std::string& version)
{
    bool valid = util::is_digit(*p);
    if (valid) {
        while (util::is_digit(*p)) {
            version.append(1, *p++);
        }
        if ((*p == '.') && util::is_digit(*(p + 1))) {
            version.append(1, *p++);
            while (util::is_digit(*p)) {
                version.append(1, *p++);
            }
        } else {
            valid = false;
        }
    }
    return valid;
}